

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

int mbedtls_entropy_func(void *data,uchar *output,size_t len)

{
  bool bVar1;
  undefined8 ctx_00;
  mbedtls_md_info_t *pmVar2;
  bool local_69;
  uchar local_68 [8];
  uchar buf [32];
  mbedtls_entropy_context *ctx;
  size_t strong_size;
  int thresholds_reached;
  int i;
  int count;
  int ret;
  size_t len_local;
  uchar *output_local;
  void *data_local;
  
  thresholds_reached = 0;
  buf._24_8_ = data;
  if (len < 0x21) {
    do {
      if (0x100 < thresholds_reached) {
        i = -0x3c;
        goto LAB_00378b87;
      }
      i = entropy_gather_internal((mbedtls_entropy_context *)buf._24_8_);
      if (i != 0) goto LAB_00378b87;
      bVar1 = true;
      ctx = (mbedtls_entropy_context *)0x0;
      for (strong_size._4_4_ = 0; strong_size._4_4_ < *(int *)(buf._24_8_ + 0x1c);
          strong_size._4_4_ = strong_size._4_4_ + 1) {
        if (*(ulong *)(buf._24_8_ + (long)strong_size._4_4_ * 0x28 + 0x30) <
            *(ulong *)(buf._24_8_ + (long)strong_size._4_4_ * 0x28 + 0x38)) {
          bVar1 = false;
        }
        if (*(int *)(buf._24_8_ + (long)strong_size._4_4_ * 0x28 + 0x40) == 1) {
          ctx = (mbedtls_entropy_context *)
                ((long)ctx->source +
                *(long *)(buf._24_8_ + (long)strong_size._4_4_ * 0x28 + 0x30) + -0x20);
        }
      }
      local_69 = !bVar1 || ctx < (mbedtls_entropy_context *)0x20;
      thresholds_reached = thresholds_reached + 1;
    } while (local_69);
    memset(local_68,0,0x20);
    i = mbedtls_md_finish((mbedtls_md_context_t *)buf._24_8_,local_68);
    if (i == 0) {
      mbedtls_md_free((mbedtls_md_context_t *)buf._24_8_);
      mbedtls_md_init((mbedtls_md_context_t *)buf._24_8_);
      ctx_00 = buf._24_8_;
      pmVar2 = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
      i = mbedtls_md_setup((mbedtls_md_context_t *)ctx_00,pmVar2,0);
      if (((i == 0) && (i = mbedtls_md_starts((mbedtls_md_context_t *)buf._24_8_), i == 0)) &&
         (i = mbedtls_md_update((mbedtls_md_context_t *)buf._24_8_,local_68,0x20), i == 0)) {
        pmVar2 = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
        i = mbedtls_md(pmVar2,local_68,0x20,local_68);
        if (i == 0) {
          for (strong_size._4_4_ = 0; strong_size._4_4_ < *(int *)(buf._24_8_ + 0x1c);
              strong_size._4_4_ = strong_size._4_4_ + 1) {
            *(undefined8 *)(buf._24_8_ + (long)strong_size._4_4_ * 0x28 + 0x30) = 0;
          }
          memcpy(output,local_68,len);
          i = 0;
        }
      }
    }
LAB_00378b87:
    mbedtls_platform_zeroize(local_68,0x20);
    data_local._4_4_ = i;
  }
  else {
    data_local._4_4_ = -0x3c;
  }
  return data_local._4_4_;
}

Assistant:

int mbedtls_entropy_func(void *data, unsigned char *output, size_t len)
{
    int ret, count = 0, i, thresholds_reached;
    size_t strong_size;
    mbedtls_entropy_context *ctx = (mbedtls_entropy_context *) data;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE];

    if (len > MBEDTLS_ENTROPY_BLOCK_SIZE) {
        return MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
    }

#if defined(MBEDTLS_ENTROPY_NV_SEED)
    /* Update the NV entropy seed before generating any entropy for outside
     * use.
     */
    if (ctx->initial_entropy_run == 0) {
        ctx->initial_entropy_run = 1;
        if ((ret = mbedtls_entropy_update_nv_seed(ctx)) != 0) {
            return ret;
        }
    }
#endif

#if defined(MBEDTLS_THREADING_C)
    if ((ret = mbedtls_mutex_lock(&ctx->mutex)) != 0) {
        return ret;
    }
#endif

    /*
     * Always gather extra entropy before a call
     */
    do {
        if (count++ > ENTROPY_MAX_LOOP) {
            ret = MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
            goto exit;
        }

        if ((ret = entropy_gather_internal(ctx)) != 0) {
            goto exit;
        }

        thresholds_reached = 1;
        strong_size = 0;
        for (i = 0; i < ctx->source_count; i++) {
            if (ctx->source[i].size < ctx->source[i].threshold) {
                thresholds_reached = 0;
            }
            if (ctx->source[i].strong == MBEDTLS_ENTROPY_SOURCE_STRONG) {
                strong_size += ctx->source[i].size;
            }
        }
    } while (!thresholds_reached || strong_size < MBEDTLS_ENTROPY_BLOCK_SIZE);

    memset(buf, 0, MBEDTLS_ENTROPY_BLOCK_SIZE);

    /*
     * Note that at this stage it is assumed that the accumulator was started
     * in a previous call to entropy_update(). If this is not guaranteed, the
     * code below will fail.
     */
    if ((ret = mbedtls_md_finish(&ctx->accumulator, buf)) != 0) {
        goto exit;
    }

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    mbedtls_md_free(&ctx->accumulator);
    mbedtls_md_init(&ctx->accumulator);
    ret = mbedtls_md_setup(&ctx->accumulator,
                           mbedtls_md_info_from_type(MBEDTLS_ENTROPY_MD), 0);
    if (ret != 0) {
        goto exit;
    }
    ret = mbedtls_md_starts(&ctx->accumulator);
    if (ret != 0) {
        goto exit;
    }
    if ((ret = mbedtls_md_update(&ctx->accumulator, buf,
                                 MBEDTLS_ENTROPY_BLOCK_SIZE)) != 0) {
        goto exit;
    }

    /*
     * Perform second hashing on entropy
     */
    if ((ret = mbedtls_md(mbedtls_md_info_from_type(MBEDTLS_ENTROPY_MD),
                          buf, MBEDTLS_ENTROPY_BLOCK_SIZE, buf)) != 0) {
        goto exit;
    }

    for (i = 0; i < ctx->source_count; i++) {
        ctx->source[i].size = 0;
    }

    memcpy(output, buf, len);

    ret = 0;

exit:
    mbedtls_platform_zeroize(buf, sizeof(buf));

#if defined(MBEDTLS_THREADING_C)
    if (mbedtls_mutex_unlock(&ctx->mutex) != 0) {
        return MBEDTLS_ERR_THREADING_MUTEX_ERROR;
    }
#endif

    return ret;
}